

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

double llvm::detail::scalbn(double __x,int __n)

{
  long *in_RSI;
  undefined4 in_register_0000003c;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  Storage local_a8 [32];
  Storage local_88 [24];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  if ((undefined1 *)*in_RSI == semPPCDoubleDouble) {
    APFloat::Storage::Storage(local_a8,(Storage *)(in_RSI[1] + 8));
    llvm::scalbn(__x_00,(int)(APFloat *)local_50);
    APFloat::Storage::Storage(local_88,(Storage *)(in_RSI[1] + 0x28));
    llvm::scalbn(__x_01,(int)(APFloat *)local_70);
    DoubleAPFloat::DoubleAPFloat
              ((DoubleAPFloat *)CONCAT44(in_register_0000003c,__n),
               (fltSemantics *)semPPCDoubleDouble,(APFloat *)local_50,(APFloat *)local_70);
    APFloat::Storage::~Storage((Storage *)(local_70 + 8));
    APFloat::Storage::~Storage(local_88);
    APFloat::Storage::~Storage((Storage *)(local_50 + 8));
    APFloat::Storage::~Storage(local_a8);
    return extraout_XMM0_Qa;
  }
  __assert_fail("Arg.Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x112e,
                "DoubleAPFloat llvm::detail::scalbn(DoubleAPFloat, int, APFloat::roundingMode)");
}

Assistant:

DoubleAPFloat scalbn(DoubleAPFloat Arg, int Exp, APFloat::roundingMode RM) {
  assert(Arg.Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  return DoubleAPFloat(semPPCDoubleDouble, scalbn(Arg.Floats[0], Exp, RM),
                       scalbn(Arg.Floats[1], Exp, RM));
}